

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_info.cc
# Opt level: O0

void __thiscall pstack::Dwarf::Abbreviation::Abbreviation(Abbreviation *this,DWARFReader *r)

{
  uint8_t uVar1;
  uintmax_t uVar2;
  intmax_t local_78;
  intmax_t local_40;
  intmax_t value;
  Form form;
  AttrName local_24;
  unsigned_long uStack_20;
  AttrName name;
  size_t i;
  DWARFReader *r_local;
  Abbreviation *this_local;
  
  i = (size_t)r;
  r_local = (DWARFReader *)this;
  uVar2 = DWARFReader::getuleb128(r);
  this->tag = (Tag)uVar2;
  uVar1 = DWARFReader::getu8((DWARFReader *)i);
  this->hasChildren = uVar1 == '\x01';
  this->sorted = false;
  std::vector<pstack::Dwarf::FormEntry,_std::allocator<pstack::Dwarf::FormEntry>_>::vector
            (&this->forms);
  this->nextSibIdx = -1;
  std::
  vector<std::pair<pstack::Dwarf::AttrName,_unsigned_long>,_std::allocator<std::pair<pstack::Dwarf::AttrName,_unsigned_long>_>_>
  ::vector(&this->attrName2Idx);
  uStack_20 = 0;
  while( true ) {
    uVar2 = DWARFReader::getuleb128((DWARFReader *)i);
    local_24 = (AttrName)uVar2;
    uVar2 = DWARFReader::getuleb128((DWARFReader *)i);
    value._0_4_ = (int)uVar2;
    if ((local_24 == DW_AT_none) && ((int)value == 0)) break;
    if (local_24 == DW_AT_sibling) {
      this->nextSibIdx = (int)uStack_20;
    }
    if ((int)value == 0x21) {
      local_78 = DWARFReader::getsleb128((DWARFReader *)i);
    }
    else {
      local_78 = 0;
    }
    local_40 = local_78;
    std::vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>>::
    emplace_back<pstack::Dwarf::Form&,long&>
              ((vector<pstack::Dwarf::FormEntry,std::allocator<pstack::Dwarf::FormEntry>> *)
               &this->forms,(Form *)&value,&local_40);
    std::
    vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
    ::emplace_back<pstack::Dwarf::AttrName&,unsigned_long&>
              ((vector<std::pair<pstack::Dwarf::AttrName,unsigned_long>,std::allocator<std::pair<pstack::Dwarf::AttrName,unsigned_long>>>
                *)&this->attrName2Idx,&local_24,&stack0xffffffffffffffe0);
    uStack_20 = uStack_20 + 1;
  }
  return;
}

Assistant:

Abbreviation::Abbreviation(DWARFReader &r)
    : tag(Tag(r.getuleb128()))
    , hasChildren(HasChildren(r.getu8()) == DW_CHILDREN_yes)
    , sorted(false)
    , nextSibIdx(-1)
{
    for (size_t i = 0;; ++i) {
        auto name = AttrName(r.getuleb128());
        auto form = Form(r.getuleb128());
        if (name == 0 && form == 0)
            break;
        if (name == DW_AT_sibling)
            nextSibIdx = int(i);
        intmax_t value = (form == DW_FORM_implicit_const) ? r.getsleb128() : 0;
        forms.emplace_back(form, value);
        attrName2Idx.emplace_back(name, i);
    }
}